

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopAddBtree(WhereLoopBuilder *pBuilder,Bitmask mPrereq)

{
  short sVar1;
  Table *pTVar2;
  long lVar3;
  i16 *piVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  LogEst LVar8;
  LogEst LVar9;
  short sVar10;
  int iVar11;
  long lVar12;
  undefined4 uVar13;
  char *in_RSI;
  Index *in_RDI;
  SrcList_item *unaff_retaddr;
  WhereLoopBuilder *in_stack_00000008;
  WhereTerm *pTerm_1;
  WhereClause *pWC2;
  int iCur;
  int ii;
  LogEst nLookup;
  Bitmask m;
  WhereTerm *pWCEnd;
  WhereTerm *pTerm;
  Index *pFirst;
  Table *pTab;
  WhereClause *pWC;
  LogEst rLogSize;
  LogEst rSize;
  int b;
  int iSortIdx;
  int rc;
  WhereLoop *pNew;
  SrcList_item *pSrc;
  SrcList *pTabList;
  i16 aiColumnPk;
  LogEst aiRowEstPk [2];
  Index sPk;
  Index *pProbe;
  WhereInfo *pWInfo;
  Bitmask in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  char cVar14;
  undefined4 in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeee;
  Expr *in_stack_fffffffffffffef0;
  WhereClause *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff04;
  LogEst in_stack_ffffffffffffff06;
  int in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff0c;
  LogEst in_stack_ffffffffffffff0e;
  WhereClause *in_stack_ffffffffffffff10;
  Expr *in_stack_ffffffffffffff18;
  Expr *in_stack_ffffffffffffff20;
  int local_b4;
  undefined2 local_96;
  undefined2 local_94;
  undefined2 local_92;
  undefined1 local_90 [8];
  undefined1 *local_88;
  undefined1 *local_80;
  long local_78;
  undefined8 local_68;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined1 local_2e;
  FKey *local_20;
  char *local_18;
  
  local_96 = 0xffff;
  local_b4 = 0;
  cVar7 = '\x01';
  pTVar2 = in_RDI->pTable;
  local_18 = in_RDI->zName;
  lVar12 = *(long *)(local_18 + 8) + 8 + (long)(int)(uint)*(byte *)&pTVar2->pIndex * 0x70;
  lVar3 = *(long *)(lVar12 + 0x20);
  piVar4 = in_RDI->aiColumn;
  if (*(long *)(lVar12 + 0x68) == 0) {
    if ((*(uint *)(lVar3 + 0x40) & 0x20) == 0) {
      memset(local_90,0,0x70);
      local_32 = 1;
      local_30 = 1;
      local_88 = (undefined1 *)&local_96;
      local_80 = (undefined1 *)&local_94;
      local_2e = 5;
      local_34 = *(undefined2 *)(lVar3 + 0x4a);
      local_94 = *(undefined2 *)(lVar3 + 0x48);
      local_92 = 0;
      if ((*(byte *)(lVar12 + 0x3d) & 1) == 0) {
        local_68 = *(undefined8 *)(*(long *)(lVar12 + 0x20) + 0x10);
      }
      local_20 = (FKey *)local_90;
      local_78 = lVar3;
    }
    else {
      local_20 = *(FKey **)(lVar3 + 0x10);
    }
  }
  else {
    local_20 = *(FKey **)(lVar12 + 0x68);
  }
  sVar1 = *(short *)(lVar3 + 0x48);
  LVar8 = estLog(0);
  if ((((in_RDI->zColAff == (char *)0x0) && ((*(ushort *)(local_18 + 0x40) & 0x20) == 0)) &&
      ((*(ulong *)(**(long **)local_18 + 0x30) & 0x8000) != 0)) &&
     (((*(long *)(lVar12 + 0x68) == 0 && ((*(byte *)(lVar12 + 0x3d) & 1) == 0)) &&
      (((*(uint *)(lVar3 + 0x40) & 0x20) == 0 &&
       (((*(byte *)(lVar12 + 0x3d) >> 3 & 1) == 0 && ((*(byte *)(lVar12 + 0x3d) >> 5 & 1) == 0))))))
     )) {
    in_stack_ffffffffffffff18 =
         (Expr *)(*(long *)(piVar4 + 0x10) + (long)*(int *)(piVar4 + 10) * 0x40);
    for (in_stack_ffffffffffffff20 = *(Expr **)(piVar4 + 0x10);
        local_b4 == 0 && in_stack_ffffffffffffff20 < in_stack_ffffffffffffff18;
        in_stack_ffffffffffffff20 = (Expr *)&in_stack_ffffffffffffff20->y) {
      uVar5._0_2_ = in_stack_ffffffffffffff20->iColumn;
      uVar5._2_2_ = in_stack_ffffffffffffff20->iAgg;
      uVar5._4_2_ = in_stack_ffffffffffffff20->iRightJoinTable;
      uVar5._6_1_ = in_stack_ffffffffffffff20->op2;
      uVar5._7_1_ = in_stack_ffffffffffffff20->field_0x37;
      if (((uVar5 & (ulong)pTVar2->aCol) == 0) &&
         (iVar11 = termCanDriveIndex((WhereTerm *)
                                     CONCAT17(local_b4 == 0 &&
                                              in_stack_ffffffffffffff20 < in_stack_ffffffffffffff18,
                                              CONCAT16(in_stack_fffffffffffffeee,
                                                       CONCAT24(in_stack_fffffffffffffeec,
                                                                in_stack_fffffffffffffee8))),
                                     (SrcList_item *)
                                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                     in_stack_fffffffffffffed8), iVar11 != 0)) {
        *(undefined2 *)&pTVar2->pSelect = 1;
        *(undefined2 *)((long)&pTVar2->zColAff + 6) = 0;
        pTVar2->pFKey = (FKey *)0x0;
        *(undefined2 *)((long)&pTVar2->zColAff + 4) = 1;
        **(undefined8 **)&pTVar2->tnum = in_stack_ffffffffffffff20;
        *(LogEst *)((long)&pTVar2->pIndex + 2) = LVar8 + sVar1;
        if ((*(long *)(lVar3 + 0x18) == 0) && ((*(uint *)(lVar3 + 0x40) & 2) == 0)) {
          *(short *)((long)&pTVar2->pIndex + 2) = *(short *)((long)&pTVar2->pIndex + 2) + 0x1c;
        }
        else {
          *(short *)((long)&pTVar2->pIndex + 2) = *(short *)((long)&pTVar2->pIndex + 2) + -10;
        }
        if (*(short *)((long)&pTVar2->pIndex + 2) < 0) {
          *(undefined2 *)((long)&pTVar2->pIndex + 2) = 0;
        }
        *(undefined2 *)((long)&pTVar2->pIndex + 6) = 0x2b;
        LVar9 = sqlite3LogEstAdd(LVar8,*(LogEst *)((long)&pTVar2->pIndex + 6));
        *(LogEst *)((long)&pTVar2->pIndex + 4) = LVar9;
        *(undefined4 *)&pTVar2->zColAff = 0x4000;
        uVar6._0_2_ = in_stack_ffffffffffffff20->iColumn;
        uVar6._2_2_ = in_stack_ffffffffffffff20->iAgg;
        uVar6._4_2_ = in_stack_ffffffffffffff20->iRightJoinTable;
        uVar6._6_1_ = in_stack_ffffffffffffff20->op2;
        uVar6._7_1_ = in_stack_ffffffffffffff20->field_0x37;
        pTVar2->zName = (char *)((ulong)in_RSI | uVar6);
        local_b4 = whereLoopInsert((WhereLoopBuilder *)in_stack_ffffffffffffff18,
                                   (WhereLoop *)in_stack_ffffffffffffff10);
      }
    }
  }
  do {
    if (local_b4 != 0 || local_20 == (FKey *)0x0) {
      return local_b4;
    }
    if (((local_20->aCol[0].zCol == (char *)0x0) ||
        (iVar11 = whereUsablePartialIndex
                            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                             in_stack_fffffffffffffef0), iVar11 != 0)) &&
       ((*(ushort *)((long)&local_20[1].zTo + 3) >> 8 & 1) == 0)) {
      sVar1 = *(short *)local_20->zTo;
      *(undefined2 *)&pTVar2->pSelect = 0;
      *(undefined2 *)((long)&pTVar2->pSelect + 2) = 0;
      *(undefined2 *)((long)&pTVar2->pSelect + 4) = 0;
      *(undefined2 *)((long)&pTVar2->zColAff + 6) = 0;
      *(undefined2 *)((long)&pTVar2->zColAff + 4) = 0;
      *(undefined1 *)((long)&pTVar2->pIndex + 1) = 0;
      *(undefined2 *)((long)&pTVar2->pIndex + 2) = 0;
      pTVar2->zName = in_RSI;
      *(short *)((long)&pTVar2->pIndex + 6) = sVar1;
      pTVar2->pFKey = local_20;
      iVar11 = indexMightHelpWithOrderBy
                         ((WhereLoopBuilder *)
                          CONCAT26(in_stack_ffffffffffffff0e,
                                   CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                          (Index *)CONCAT26(in_stack_ffffffffffffff06,
                                            CONCAT24(in_stack_ffffffffffffff04,
                                                     in_stack_ffffffffffffff00)),
                          (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      if (*(int *)&local_20[1].pNextFrom < 1) {
        *(undefined4 *)&pTVar2->zColAff = 0x100;
        cVar14 = cVar7;
        if (iVar11 == 0) {
          cVar14 = '\0';
        }
        *(char *)((long)&pTVar2->pIndex + 1) = cVar14;
        *(short *)((long)&pTVar2->pIndex + 4) = sVar1 + 0x10;
        whereLoopOutputAdjust
                  (in_stack_ffffffffffffff10,
                   (WhereLoop *)
                   CONCAT26(in_stack_ffffffffffffff0e,
                            CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                   in_stack_ffffffffffffff06);
        iVar11 = whereLoopInsert((WhereLoopBuilder *)in_stack_ffffffffffffff18,
                                 (WhereLoop *)in_stack_ffffffffffffff10);
        *(short *)((long)&pTVar2->pIndex + 6) = sVar1;
joined_r0x001c4fd0:
        if (iVar11 != 0) {
          return iVar11;
        }
      }
      else {
        if ((*(ushort *)((long)&local_20[1].zTo + 3) >> 5 & 1) == 0) {
          in_stack_ffffffffffffff10 =
               (WhereClause *)(*(ulong *)(lVar12 + 0x58) & (ulong)local_20[1].pNextTo);
          uVar13 = 0x200;
          if (in_stack_ffffffffffffff10 == (WhereClause *)0x0) {
            uVar13 = 0x240;
          }
          *(undefined4 *)&pTVar2->zColAff = uVar13;
        }
        else {
          *(undefined4 *)&pTVar2->zColAff = 0x240;
          in_stack_ffffffffffffff10 = (WhereClause *)0x0;
        }
        if ((((iVar11 != 0) || ((*(uint *)(lVar3 + 0x40) & 0x20) != 0)) ||
            (local_20->aCol[0].zCol != (char *)0x0)) ||
           (((in_stack_ffffffffffffff10 == (WhereClause *)0x0 &&
             ((*(ushort *)((long)&local_20[1].zTo + 3) >> 2 & 1) == 0)) &&
            ((*(short *)((long)&local_20[1].pNextFrom + 4) < *(short *)(lVar3 + 0x4a) &&
             ((((*(ushort *)(local_18 + 0x40) & 4) == 0 && (sqlite3Config.bUseCis != 0)) &&
              ((*(ushort *)(**(long **)local_18 + 0x5c) & 0x20) == 0)))))))) {
          cVar14 = cVar7;
          if (iVar11 == 0) {
            cVar14 = '\0';
          }
          *(char *)((long)&pTVar2->pIndex + 1) = cVar14;
          *(short *)((long)&pTVar2->pIndex + 4) =
               sVar1 + 1 +
               (short)((*(short *)((long)&local_20[1].pNextFrom + 4) * 0xf) /
                      (int)*(short *)(lVar3 + 0x4a));
          if (in_stack_ffffffffffffff10 != (WhereClause *)0x0) {
            in_stack_ffffffffffffff04 = (undefined2)*(undefined4 *)(lVar12 + 0x40);
            in_stack_ffffffffffffff06 = (LogEst)((uint)*(undefined4 *)(lVar12 + 0x40) >> 0x10);
            in_stack_fffffffffffffef8 = (WhereClause *)(local_18 + 0x68);
            in_stack_ffffffffffffff0e = sVar1 + 0x10;
            for (in_stack_ffffffffffffff08 = 0;
                in_stack_ffffffffffffff08 < in_stack_fffffffffffffef8->nTerm;
                in_stack_ffffffffffffff08 = in_stack_ffffffffffffff08 + 1) {
              in_stack_fffffffffffffef0 =
                   (Expr *)(in_stack_fffffffffffffef8->a + in_stack_ffffffffffffff08);
              iVar11 = sqlite3ExprCoveredByIndex
                                 (in_stack_ffffffffffffff20,
                                  (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                                  (Index *)in_stack_ffffffffffffff10);
              if (iVar11 == 0) break;
              if (*(short *)&in_stack_fffffffffffffef0->pLeft < 1) {
                sVar10 = in_stack_ffffffffffffff0e + *(short *)&in_stack_fffffffffffffef0->pLeft;
              }
              else {
                sVar10 = in_stack_ffffffffffffff0e + -1;
                if (((ulong)in_stack_fffffffffffffef0->pLeft & 0x8200000000) != 0) {
                  sVar10 = in_stack_ffffffffffffff0e + -0x14;
                }
              }
              in_stack_ffffffffffffff0e = sVar10;
            }
            LVar8 = sqlite3LogEstAdd(*(LogEst *)((long)&pTVar2->pIndex + 4),
                                     in_stack_ffffffffffffff0e);
            *(LogEst *)((long)&pTVar2->pIndex + 4) = LVar8;
          }
          whereLoopOutputAdjust
                    (in_stack_ffffffffffffff10,
                     (WhereLoop *)
                     CONCAT26(in_stack_ffffffffffffff0e,
                              CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                     in_stack_ffffffffffffff06);
          iVar11 = whereLoopInsert((WhereLoopBuilder *)in_stack_ffffffffffffff18,
                                   (WhereLoop *)in_stack_ffffffffffffff10);
          *(short *)((long)&pTVar2->pIndex + 6) = sVar1;
          goto joined_r0x001c4fd0;
        }
      }
      *(undefined4 *)&in_RDI->pNext = 0;
      local_b4 = whereLoopAddBtreeIndex
                           (in_stack_00000008,unaff_retaddr,in_RDI,(LogEst)((ulong)in_RSI >> 0x30));
      if (*(int *)&in_RDI->pNext == 1) {
        *(uint *)(lVar3 + 0x40) = *(uint *)(lVar3 + 0x40) | 0x100;
      }
    }
    if (*(long *)(lVar12 + 0x68) == 0) {
      local_20 = *(FKey **)&local_20->nCol;
    }
    else {
      local_20 = (FKey *)0x0;
    }
    cVar7 = cVar7 + '\x01';
  } while( true );
}

Assistant:

static int whereLoopAddBtree(
  WhereLoopBuilder *pBuilder, /* WHERE clause information */
  Bitmask mPrereq             /* Extra prerequesites for using this table */
){
  WhereInfo *pWInfo;          /* WHERE analysis context */
  Index *pProbe;              /* An index we are evaluating */
  Index sPk;                  /* A fake index object for the primary key */
  LogEst aiRowEstPk[2];       /* The aiRowLogEst[] value for the sPk index */
  i16 aiColumnPk = -1;        /* The aColumn[] value for the sPk index */
  SrcList *pTabList;          /* The FROM clause */
  struct SrcList_item *pSrc;  /* The FROM clause btree term to add */
  WhereLoop *pNew;            /* Template WhereLoop object */
  int rc = SQLITE_OK;         /* Return code */
  int iSortIdx = 1;           /* Index number */
  int b;                      /* A boolean value */
  LogEst rSize;               /* number of rows in the table */
  LogEst rLogSize;            /* Logarithm of the number of rows in the table */
  WhereClause *pWC;           /* The parsed WHERE clause */
  Table *pTab;                /* Table being queried */
  
  pNew = pBuilder->pNew;
  pWInfo = pBuilder->pWInfo;
  pTabList = pWInfo->pTabList;
  pSrc = pTabList->a + pNew->iTab;
  pTab = pSrc->pTab;
  pWC = pBuilder->pWC;
  assert( !IsVirtual(pSrc->pTab) );

  if( pSrc->pIBIndex ){
    /* An INDEXED BY clause specifies a particular index to use */
    pProbe = pSrc->pIBIndex;
  }else if( !HasRowid(pTab) ){
    pProbe = pTab->pIndex;
  }else{
    /* There is no INDEXED BY clause.  Create a fake Index object in local
    ** variable sPk to represent the rowid primary key index.  Make this
    ** fake index the first in a chain of Index objects with all of the real
    ** indices to follow */
    Index *pFirst;                  /* First of real indices on the table */
    memset(&sPk, 0, sizeof(Index));
    sPk.nKeyCol = 1;
    sPk.nColumn = 1;
    sPk.aiColumn = &aiColumnPk;
    sPk.aiRowLogEst = aiRowEstPk;
    sPk.onError = OE_Replace;
    sPk.pTable = pTab;
    sPk.szIdxRow = pTab->szTabRow;
    aiRowEstPk[0] = pTab->nRowLogEst;
    aiRowEstPk[1] = 0;
    pFirst = pSrc->pTab->pIndex;
    if( pSrc->fg.notIndexed==0 ){
      /* The real indices of the table are only considered if the
      ** NOT INDEXED qualifier is omitted from the FROM clause */
      sPk.pNext = pFirst;
    }
    pProbe = &sPk;
  }
  rSize = pTab->nRowLogEst;
  rLogSize = estLog(rSize);

#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
  /* Automatic indexes */
  if( !pBuilder->pOrSet      /* Not part of an OR optimization */
   && (pWInfo->wctrlFlags & WHERE_OR_SUBCLAUSE)==0
   && (pWInfo->pParse->db->flags & SQLITE_AutoIndex)!=0
   && pSrc->pIBIndex==0      /* Has no INDEXED BY clause */
   && !pSrc->fg.notIndexed   /* Has no NOT INDEXED clause */
   && HasRowid(pTab)         /* Not WITHOUT ROWID table. (FIXME: Why not?) */
   && !pSrc->fg.isCorrelated /* Not a correlated subquery */
   && !pSrc->fg.isRecursive  /* Not a recursive common table expression. */
  ){
    /* Generate auto-index WhereLoops */
    WhereTerm *pTerm;
    WhereTerm *pWCEnd = pWC->a + pWC->nTerm;
    for(pTerm=pWC->a; rc==SQLITE_OK && pTerm<pWCEnd; pTerm++){
      if( pTerm->prereqRight & pNew->maskSelf ) continue;
      if( termCanDriveIndex(pTerm, pSrc, 0) ){
        pNew->u.btree.nEq = 1;
        pNew->nSkip = 0;
        pNew->u.btree.pIndex = 0;
        pNew->nLTerm = 1;
        pNew->aLTerm[0] = pTerm;
        /* TUNING: One-time cost for computing the automatic index is
        ** estimated to be X*N*log2(N) where N is the number of rows in
        ** the table being indexed and where X is 7 (LogEst=28) for normal
        ** tables or 0.5 (LogEst=-10) for views and subqueries.  The value
        ** of X is smaller for views and subqueries so that the query planner
        ** will be more aggressive about generating automatic indexes for
        ** those objects, since there is no opportunity to add schema
        ** indexes on subqueries and views. */
        pNew->rSetup = rLogSize + rSize;
        if( pTab->pSelect==0 && (pTab->tabFlags & TF_Ephemeral)==0 ){
          pNew->rSetup += 28;
        }else{
          pNew->rSetup -= 10;
        }
        ApplyCostMultiplier(pNew->rSetup, pTab->costMult);
        if( pNew->rSetup<0 ) pNew->rSetup = 0;
        /* TUNING: Each index lookup yields 20 rows in the table.  This
        ** is more than the usual guess of 10 rows, since we have no way
        ** of knowing how selective the index will ultimately be.  It would
        ** not be unreasonable to make this value much larger. */
        pNew->nOut = 43;  assert( 43==sqlite3LogEst(20) );
        pNew->rRun = sqlite3LogEstAdd(rLogSize,pNew->nOut);
        pNew->wsFlags = WHERE_AUTO_INDEX;
        pNew->prereq = mPrereq | pTerm->prereqRight;
        rc = whereLoopInsert(pBuilder, pNew);
      }
    }
  }
#endif /* SQLITE_OMIT_AUTOMATIC_INDEX */

  /* Loop over all indices. If there was an INDEXED BY clause, then only 
  ** consider index pProbe.  */
  for(; rc==SQLITE_OK && pProbe; 
      pProbe=(pSrc->pIBIndex ? 0 : pProbe->pNext), iSortIdx++
  ){
    if( pProbe->pPartIdxWhere!=0
     && !whereUsablePartialIndex(pSrc->iCursor, pWC, pProbe->pPartIdxWhere) ){
      testcase( pNew->iTab!=pSrc->iCursor );  /* See ticket [98d973b8f5] */
      continue;  /* Partial index inappropriate for this query */
    }
    if( pProbe->bNoQuery ) continue;
    rSize = pProbe->aiRowLogEst[0];
    pNew->u.btree.nEq = 0;
    pNew->u.btree.nBtm = 0;
    pNew->u.btree.nTop = 0;
    pNew->nSkip = 0;
    pNew->nLTerm = 0;
    pNew->iSortIdx = 0;
    pNew->rSetup = 0;
    pNew->prereq = mPrereq;
    pNew->nOut = rSize;
    pNew->u.btree.pIndex = pProbe;
    b = indexMightHelpWithOrderBy(pBuilder, pProbe, pSrc->iCursor);
    /* The ONEPASS_DESIRED flags never occurs together with ORDER BY */
    assert( (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || b==0 );
    if( pProbe->tnum<=0 ){
      /* Integer primary key index */
      pNew->wsFlags = WHERE_IPK;

      /* Full table scan */
      pNew->iSortIdx = b ? iSortIdx : 0;
      /* TUNING: Cost of full table scan is (N*3.0). */
      pNew->rRun = rSize + 16;
      ApplyCostMultiplier(pNew->rRun, pTab->costMult);
      whereLoopOutputAdjust(pWC, pNew, rSize);
      rc = whereLoopInsert(pBuilder, pNew);
      pNew->nOut = rSize;
      if( rc ) break;
    }else{
      Bitmask m;
      if( pProbe->isCovering ){
        pNew->wsFlags = WHERE_IDX_ONLY | WHERE_INDEXED;
        m = 0;
      }else{
        m = pSrc->colUsed & pProbe->colNotIdxed;
        pNew->wsFlags = (m==0) ? (WHERE_IDX_ONLY|WHERE_INDEXED) : WHERE_INDEXED;
      }

      /* Full scan via index */
      if( b
       || !HasRowid(pTab)
       || pProbe->pPartIdxWhere!=0
       || ( m==0
         && pProbe->bUnordered==0
         && (pProbe->szIdxRow<pTab->szTabRow)
         && (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0
         && sqlite3GlobalConfig.bUseCis
         && OptimizationEnabled(pWInfo->pParse->db, SQLITE_CoverIdxScan)
          )
      ){
        pNew->iSortIdx = b ? iSortIdx : 0;

        /* The cost of visiting the index rows is N*K, where K is
        ** between 1.1 and 3.0, depending on the relative sizes of the
        ** index and table rows. */
        pNew->rRun = rSize + 1 + (15*pProbe->szIdxRow)/pTab->szTabRow;
        if( m!=0 ){
          /* If this is a non-covering index scan, add in the cost of
          ** doing table lookups.  The cost will be 3x the number of
          ** lookups.  Take into account WHERE clause terms that can be
          ** satisfied using just the index, and that do not require a
          ** table lookup. */
          LogEst nLookup = rSize + 16;  /* Base cost:  N*3 */
          int ii;
          int iCur = pSrc->iCursor;
          WhereClause *pWC2 = &pWInfo->sWC;
          for(ii=0; ii<pWC2->nTerm; ii++){
            WhereTerm *pTerm = &pWC2->a[ii];
            if( !sqlite3ExprCoveredByIndex(pTerm->pExpr, iCur, pProbe) ){
              break;
            }
            /* pTerm can be evaluated using just the index.  So reduce
            ** the expected number of table lookups accordingly */
            if( pTerm->truthProb<=0 ){
              nLookup += pTerm->truthProb;
            }else{
              nLookup--;
              if( pTerm->eOperator & (WO_EQ|WO_IS) ) nLookup -= 19;
            }
          }
          
          pNew->rRun = sqlite3LogEstAdd(pNew->rRun, nLookup);
        }
        ApplyCostMultiplier(pNew->rRun, pTab->costMult);
        whereLoopOutputAdjust(pWC, pNew, rSize);
        rc = whereLoopInsert(pBuilder, pNew);
        pNew->nOut = rSize;
        if( rc ) break;
      }
    }

    pBuilder->bldFlags = 0;
    rc = whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, 0);
    if( pBuilder->bldFlags==SQLITE_BLDF_INDEXED ){
      /* If a non-unique index is used, or if a prefix of the key for
      ** unique index is used (making the index functionally non-unique)
      ** then the sqlite_stat1 data becomes important for scoring the
      ** plan */
      pTab->tabFlags |= TF_StatsUsed;
    }
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3Stat4ProbeFree(pBuilder->pRec);
    pBuilder->nRecValid = 0;
    pBuilder->pRec = 0;
#endif
  }
  return rc;
}